

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlCatalogConvertEntry(void *payload,void *data,xmlChar *name)

{
  long *local_38;
  xmlCatalogEntryPtr prev;
  xmlCatalogPtr catal;
  xmlCatalogEntryPtr entry;
  xmlChar *name_local;
  void *data_local;
  void *payload_local;
  
  if ((((payload != (void *)0x0) && (data != (void *)0x0)) && (*(long *)((long)data + 0x60) != 0))
     && (*(long *)((long)data + 0x70) != 0)) {
    switch(*(undefined4 *)((long)payload + 0x18)) {
    case 0xd:
      *(undefined4 *)((long)payload + 0x18) = 6;
      break;
    case 0xe:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0xf:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0x10:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0x11:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0x12:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0x13:
      *(undefined4 *)((long)payload + 0x18) = 5;
      break;
    case 0x14:
      *(undefined4 *)((long)payload + 0x18) = 8;
      break;
    default:
      xmlHashRemoveEntry(*(xmlHashTablePtr *)((long)data + 0x60),*(xmlChar **)((long)payload + 0x20)
                         ,xmlFreeCatalogEntry);
      return;
    case 0x16:
      *(undefined4 *)((long)payload + 0x18) = 1;
    }
    xmlHashRemoveEntry(*(xmlHashTablePtr *)((long)data + 0x60),*(xmlChar **)((long)payload + 0x20),
                       (xmlHashDeallocator)0x0);
    *(undefined8 *)((long)payload + 8) = *(undefined8 *)((long)data + 0x70);
    *(undefined8 *)payload = 0;
    if (*(long *)(*(long *)((long)data + 0x70) + 0x10) == 0) {
      *(void **)(*(long *)((long)data + 0x70) + 0x10) = payload;
    }
    else {
      for (local_38 = *(long **)(*(long *)((long)data + 0x70) + 0x10); *local_38 != 0;
          local_38 = (long *)*local_38) {
      }
      *local_38 = (long)payload;
    }
  }
  return;
}

Assistant:

static void
xmlCatalogConvertEntry(void *payload, void *data,
                       const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr entry = (xmlCatalogEntryPtr) payload;
    xmlCatalogPtr catal = (xmlCatalogPtr) data;
    if ((entry == NULL) || (catal == NULL) || (catal->sgml == NULL) ||
	(catal->xml == NULL))
	return;
    switch (entry->type) {
	case SGML_CATA_ENTITY:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_PENTITY:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_DOCTYPE:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_LINKTYPE:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_NOTATION:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_PUBLIC:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_SYSTEM:
	    entry->type = XML_CATA_SYSTEM;
	    break;
	case SGML_CATA_DELEGATE:
	    entry->type = XML_CATA_DELEGATE_PUBLIC;
	    break;
	case SGML_CATA_CATALOG:
	    entry->type = XML_CATA_CATALOG;
	    break;
	default:
	    xmlHashRemoveEntry(catal->sgml, entry->name, xmlFreeCatalogEntry);
	    return;
    }
    /*
     * Conversion successful, remove from the SGML catalog
     * and add it to the default XML one
     */
    xmlHashRemoveEntry(catal->sgml, entry->name, NULL);
    entry->parent = catal->xml;
    entry->next = NULL;
    if (catal->xml->children == NULL)
	catal->xml->children = entry;
    else {
	xmlCatalogEntryPtr prev;

	prev = catal->xml->children;
	while (prev->next != NULL)
	    prev = prev->next;
	prev->next = entry;
    }
}